

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode curl_mime_filedata(curl_mimepart *part,char *filename)

{
  curl_strdup_callback p_Var1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  stat sbuf;
  stat64 local_c0;
  
  if (part == (curl_mimepart *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if (part->freefunc != (curl_free_callback)0x0) {
    (*part->freefunc)(part->arg);
  }
  part->readfunc = (curl_read_callback)0x0;
  part->seekfunc = (curl_seek_callback)0x0;
  part->freefunc = (curl_free_callback)0x0;
  part->arg = part;
  part->data = (char *)0x0;
  part->fp = (FILE *)0x0;
  part->datasize = 0;
  (part->encstate).pos = 0;
  (part->encstate).bufbeg = 0;
  (part->encstate).bufend = 0;
  part->kind = MIMEKIND_NONE;
  if (filename != (char *)0x0) {
    iVar2 = stat64(filename,&local_c0);
    if ((iVar2 == 0) && (iVar2 = access(filename,4), iVar2 == 0)) {
      CVar5 = CURLE_OK;
    }
    else {
      CVar5 = CURLE_READ_ERROR;
    }
    pcVar3 = (*Curl_cstrdup)(filename);
    part->data = pcVar3;
    CVar6 = CURLE_OUT_OF_MEMORY;
    if (pcVar3 == (char *)0x0) {
      CVar5 = CURLE_OUT_OF_MEMORY;
    }
    part->datasize = -1;
    if ((CVar5 == CURLE_OK) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
      part->datasize = local_c0.st_size;
      part->seekfunc = mime_file_seek;
    }
    part->readfunc = mime_file_read;
    part->freefunc = mime_file_free;
    part->kind = MIMEKIND_FILE;
    pcVar3 = (*Curl_cstrdup)(filename);
    p_Var1 = Curl_cstrdup;
    if (pcVar3 != (char *)0x0) {
      pcVar4 = __xpg_basename(pcVar3);
      pcVar4 = (*p_Var1)(pcVar4);
      (*Curl_cfree)(pcVar3);
      if (pcVar4 != (char *)0x0) {
        (*Curl_cfree)(part->filename);
        part->filename = (char *)0x0;
        pcVar3 = (*Curl_cstrdup)(pcVar4);
        part->filename = pcVar3;
        CVar6 = CVar5;
        if (pcVar3 == (char *)0x0) {
          CVar6 = CURLE_OUT_OF_MEMORY;
        }
        (*Curl_cfree)(pcVar4);
      }
    }
    return CVar6;
  }
  return CURLE_OK;
}

Assistant:

CURLcode curl_mime_filedata(curl_mimepart *part, const char *filename)
{
  CURLcode result = CURLE_OK;

  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(filename) {
    char *base;
    struct_stat sbuf;

    if(stat(filename, &sbuf) || access(filename, R_OK))
      result = CURLE_READ_ERROR;

    part->data = strdup(filename);
    if(!part->data)
      result = CURLE_OUT_OF_MEMORY;

    part->datasize = -1;
    if(!result && S_ISREG(sbuf.st_mode)) {
      part->datasize = filesize(filename, sbuf);
      part->seekfunc = mime_file_seek;
    }

    part->readfunc = mime_file_read;
    part->freefunc = mime_file_free;
    part->kind = MIMEKIND_FILE;

    /* As a side effect, set the filename to the current file's base name.
       It is possible to withdraw this by explicitly calling
       curl_mime_filename() with a NULL filename argument after the current
       call. */
    base = strippath(filename);
    if(!base)
      result = CURLE_OUT_OF_MEMORY;
    else {
      CURLcode res = curl_mime_filename(part, base);

      if(res)
        result = res;
      free(base);
    }
  }
  return result;
}